

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  PromiseArena *pPVar4;
  _func_int *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  _func_int *p_Var16;
  _func_int **pp_Var17;
  anon_class_8_1_8991fb9c *func;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  Event *extraout_RDX_02;
  Event *extraout_RDX_03;
  Event *extraout_RDX_04;
  Event *pEVar18;
  long in_RSI;
  Exception *exception;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar19;
  NullableValue<kj::Exception> _exception326;
  ExceptionOr<kj::_::Void> result;
  kj local_508 [8];
  undefined1 local_500 [16];
  _func_int **pp_Stack_4f0;
  EventLoop *local_4e8;
  Event *local_4e0;
  Event **ppEStack_4d8;
  char *local_4d0;
  char *pcStack_4c8;
  ArrayDisposer *local_4c0;
  Disposer *local_4b8;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> local_4b0;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *local_4a8;
  TaskSet *pTStack_4a0;
  OwnPromiseNode local_498;
  undefined1 local_490 [264];
  Detail *local_388;
  RemoveConst<kj::Exception::Detail> *pRStack_380;
  Detail *local_378;
  ArrayDisposer *local_370;
  char local_368;
  undefined1 local_360 [40];
  char *local_338;
  size_t local_330;
  ArrayDisposer *local_328;
  Disposer *local_320;
  Context *local_318;
  char *local_310;
  size_t local_308;
  ArrayDisposer *local_300;
  undefined1 local_2f8 [264];
  Detail *local_1f0;
  RemoveConst<kj::Exception::Detail> *local_1e8;
  Detail *local_1e0;
  ArrayDisposer *local_1d8;
  undefined1 local_1d0;
  Maybe<kj::Exception> local_1c8;
  
  local_368 = '\0';
  local_1d0 = 0;
  (**(code **)(**(long **)(in_RSI + 0x68) + 0x18))();
  runCatchingExceptions<kj::TaskSet::Task::fire()::_lambda()_1_>(&local_1c8,local_508,func);
  uVar12 = local_1c8.ptr.field_1.value.remoteTrace.content.size_;
  uVar11 = local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
  uVar10 = local_1c8.ptr.field_1.value.context.ptr.ptr;
  uVar9 = local_1c8.ptr.field_1.value.description.content.size_;
  uVar8 = local_1c8.ptr.field_1.value.description.content.ptr;
  uVar7 = local_1c8.ptr.field_1.value.ownFile.content.size_;
  uVar6 = local_1c8.ptr.field_1.value.ownFile.content.ptr;
  local_500[0] = local_1c8.ptr.isSet;
  if (local_1c8.ptr.isSet != false) {
    local_500._8_8_ = local_1c8.ptr.field_1.value.ownFile.content.ptr;
    pp_Stack_4f0 = (_func_int **)local_1c8.ptr.field_1.value.ownFile.content.size_;
    local_4e8 = (EventLoop *)local_1c8.ptr.field_1.value.ownFile.content.disposer;
    local_1c8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.ownFile.content.size_ = 0;
    local_4e0 = (Event *)local_1c8.ptr.field_1.value.file;
    ppEStack_4d8 = (Event **)local_1c8.ptr.field_1._32_8_;
    local_4d0 = local_1c8.ptr.field_1.value.description.content.ptr;
    pcStack_4c8 = (char *)local_1c8.ptr.field_1.value.description.content.size_;
    local_4c0 = local_1c8.ptr.field_1.value.description.content.disposer;
    local_1c8.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.description.content.size_ = 0;
    local_4b8 = local_1c8.ptr.field_1.value.context.ptr.disposer;
    local_4b0.ptr.ptr =
         (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>)
         (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>)local_1c8.ptr.field_1.value.context.ptr.ptr
    ;
    local_1c8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_4a8 = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)
                local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
    pTStack_4a0 = (TaskSet *)local_1c8.ptr.field_1.value.remoteTrace.content.size_;
    local_498.ptr = (PromiseNode *)local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
    local_1c8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy(local_490,(void *)((long)&local_1c8.ptr.field_1 + 0x68),0x105);
    uVar15 = local_1c8.ptr.field_1.value.details.builder.endPtr;
    uVar14 = local_1c8.ptr.field_1.value.details.builder.pos;
    uVar13 = local_1c8.ptr.field_1.value.details.builder.ptr;
    local_388 = local_1c8.ptr.field_1.value.details.builder.ptr;
    pRStack_380 = local_1c8.ptr.field_1.value.details.builder.pos;
    local_378 = local_1c8.ptr.field_1.value.details.builder.endPtr;
    local_370 = local_1c8.ptr.field_1.value.details.builder.disposer;
    local_1c8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1c8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1c8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    Exception::~Exception(&local_1c8.ptr.field_1.value);
    if (local_368 == '\0') {
      local_360._0_8_ = uVar6;
      local_360._8_8_ = uVar7;
      local_360._16_8_ = local_1c8.ptr.field_1.value.ownFile.content.disposer;
      local_500._8_8_ = (PromiseArena *)0x0;
      pp_Stack_4f0 = (_func_int **)0x0;
      local_360._24_8_ = local_4e0;
      local_360._32_8_ = ppEStack_4d8;
      local_338 = (char *)uVar8;
      local_330 = uVar9;
      local_328 = local_1c8.ptr.field_1.value.description.content.disposer;
      local_4d0 = (char *)0x0;
      pcStack_4c8 = (char *)0x0;
      local_320 = local_1c8.ptr.field_1.value.context.ptr.disposer;
      local_318 = (Context *)uVar10;
      local_4b0.ptr.ptr = (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>)(Task *)0x0;
      local_310 = (char *)uVar11;
      local_308 = uVar12;
      local_300 = local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
      local_4a8 = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)0x0;
      pTStack_4a0 = (TaskSet *)0x0;
      memcpy(local_2f8,local_490,0x105);
      local_1f0 = (Detail *)uVar13;
      local_1e8 = (RemoveConst<kj::Exception::Detail> *)uVar14;
      local_1e0 = (Detail *)uVar15;
      local_1d8 = local_1c8.ptr.field_1.value.details.builder.disposer;
      local_388 = (Detail *)0x0;
      pRStack_380 = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_378 = (Detail *)0x0;
      local_368 = '\x01';
    }
    Exception::~Exception((Exception *)(local_500 + 8));
  }
  pop((Task *)local_500);
  plVar1 = *(long **)(*(long *)(in_RSI + 0x60) + 0x18);
  pEVar18 = extraout_RDX;
  if ((plVar1 != (long *)0x0) && (*(long *)(*(long *)(in_RSI + 0x60) + 8) == 0)) {
    (**(code **)(*plVar1 + 0x10))(plVar1,&local_1c8);
    lVar2 = *(long *)(in_RSI + 0x60);
    puVar3 = *(undefined8 **)(lVar2 + 0x10);
    plVar1 = *(long **)(lVar2 + 0x18);
    *(undefined8 *)(lVar2 + 0x10) = 0;
    *(undefined8 *)(lVar2 + 0x18) = 0;
    pEVar18 = extraout_RDX_00;
    if (plVar1 != (long *)0x0) {
      (**(code **)*puVar3)(puVar3,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      pEVar18 = extraout_RDX_01;
    }
  }
  if (local_368 == '\x01') {
    (*(code *)**(undefined8 **)**(undefined8 **)(in_RSI + 0x60))
              ((undefined8 *)**(undefined8 **)(in_RSI + 0x60),(Exception *)local_360);
    pEVar18 = extraout_RDX_02;
  }
  p_Var5 = (_func_int *)CONCAT71(local_500._1_7_,local_500[0]);
  pPVar4 = (PromiseArena *)(p_Var5 + 0x10);
  if (p_Var5 == (_func_int *)0x0) {
    p_Var16 = (_func_int *)0x0;
    pPVar4 = (PromiseArena *)0x0;
  }
  else {
    p_Var16 = p_Var5 + *(long *)(*(long *)p_Var5 + -0x10);
  }
  if (p_Var16 == p_Var5) {
    pp_Var17 = (_func_int **)
               &kj::_::StaticDisposerAdapter<kj::TaskSet::Task,kj::_::PromiseDisposer>::instance;
  }
  else {
    pp_Var17 = (_func_int **)operator_new(0x10);
    pp_Var17[1] = p_Var5;
    *pp_Var17 = (_func_int *)&PTR_disposeImpl_0037fbd8;
    pEVar18 = extraout_RDX_03;
  }
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = pp_Var17;
  (this->super_PromiseArenaMember).arena = pPVar4;
  if (local_368 == '\x01') {
    Exception::~Exception((Exception *)local_360);
    pEVar18 = extraout_RDX_04;
  }
  MVar19.ptr.ptr = pEVar18;
  MVar19.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar19.ptr;
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(exception));
    }

    // Remove from the task list. Do this before calling taskFailed(), so that taskFailed() can
    // safely call clear().
    auto self = pop();

    // We'll also process onEmpty() now, just in case `taskFailed()` actually destroys the whole
    // `TaskSet`.
    KJ_IF_SOME(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == kj::none) {
        f->fulfill();
        taskSet.emptyFulfiller = kj::none;
      }
    }

    // Call the error handler if there was an exception.
    KJ_IF_SOME(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(e));
    }

    return Own<Event>(mv(self));
  }